

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.h
# Opt level: O0

bool __thiscall
QItemSelectionRange::contains(QItemSelectionRange *this,int row,int column,QModelIndex *parentIndex)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QModelIndex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QPersistentModelIndex::row();
  local_39 = false;
  if (in_ESI <= iVar2) {
    iVar2 = QPersistentModelIndex::column();
    local_39 = false;
    if (in_EDX <= iVar2) {
      iVar2 = QPersistentModelIndex::row();
      local_39 = false;
      if (iVar2 <= in_ESI) {
        iVar2 = QPersistentModelIndex::column();
        local_39 = false;
        if (iVar2 <= in_EDX) {
          parent((QItemSelectionRange *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
          local_39 = ::operator==((QModelIndex *)
                                  CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                  in_stack_ffffffffffffffa8);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

inline bool contains(int row, int column, const QModelIndex &parentIndex) const
    {
        return (br.row() >= row && br.column() >= column &&
                tl.row() <= row && tl.column() <= column &&
                parent() == parentIndex);
    }